

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O2

string * benchmark::anon_unknown_1::FormatKV
                   (string *__return_storage_ptr__,string *key,int64_t value)

{
  ostream *poVar1;
  stringstream ss;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_190,'\"');
  poVar1 = std::operator<<(poVar1,(string *)key);
  poVar1 = std::operator<<(poVar1,"\": ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatKV(std::string const& key, int64_t value) {
  std::stringstream ss;
  ss << '"' << key << "\": " << value;
  return ss.str();
}